

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1591.c
# Opt level: O0

size_t read_callback(void *ptr,size_t size,size_t nmemb,void *stream)

{
  size_t sVar1;
  size_t sVar2;
  void *local_38;
  size_t amount;
  void *stream_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  sVar1 = consumed;
  local_38 = (void *)(nmemb * size);
  sVar2 = strlen(data);
  if (sVar1 == sVar2) {
    ptr_local = (void *)0x0;
  }
  else {
    sVar2 = strlen(data);
    if ((void *)(sVar2 - consumed) < local_38) {
      local_38 = (void *)strlen(data);
    }
    consumed = (long)local_38 + consumed;
    memcpy(ptr,data,(size_t)local_38);
    ptr_local = local_38;
  }
  return (size_t)ptr_local;
}

Assistant:

static size_t read_callback(void *ptr, size_t size, size_t nmemb, void *stream)
{
  size_t  amount = nmemb * size; /* Total bytes curl wants */

  if(consumed == strlen(data)) {
    return 0;
  }

  if(amount > strlen(data)-consumed) {
    amount = strlen(data);
  }

  consumed += amount;
  (void)stream;
  memcpy(ptr, data, amount);
  return amount;
}